

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::~RpcPipeline(RpcPipeline *this)

{
  PromiseArenaMember *node;
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook>_>::Entry> *pRVar5
  ;
  Entry *pEVar6;
  ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  *pFVar7;
  Disposer *pDVar8;
  RpcConnectionState *pRVar9;
  
  node = &((this->resolveSelfPromise).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->resolveSelfPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pHVar1 = (this->clientMap).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->clientMap).table.indexes.buckets.size_;
    (this->clientMap).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->clientMap).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->clientMap).table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->clientMap).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->clientMap).table.rows.builder.pos;
    pEVar6 = (this->clientMap).table.rows.builder.endPtr;
    (this->clientMap).table.rows.builder.ptr = (Entry *)0x0;
    (this->clientMap).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook>_>::Entry>
          *)0x0;
    (this->clientMap).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->clientMap).table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar4,0x28,((long)pRVar5 - (long)pEVar4 >> 3) * -0x3333333333333333,
               ((long)pEVar6 - (long)pEVar4 >> 3) * -0x3333333333333333,
               kj::ArrayDisposer::
               Dispose_<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
               ::destruct);
  }
  kj::
  OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>,_kj::Exception>
  ::destroy(&this->state);
  if (((this->redirectLater).ptr.isSet == true) &&
     (pFVar7 = (this->redirectLater).ptr.field_1.value.hub.ptr,
     pFVar7 != (ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                *)0x0)) {
    (this->redirectLater).ptr.field_1.value.hub.ptr =
         (ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
          *)0x0;
    pDVar8 = (this->redirectLater).ptr.field_1.value.hub.disposer;
    (**pDVar8->_vptr_Disposer)
              (pDVar8,(_func_int *)
                      ((long)&(pFVar7->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar7->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pRVar9 = (this->connectionState).ptr;
  if (pRVar9 != (RpcConnectionState *)0x0) {
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    pDVar8 = (this->connectionState).disposer;
    (**pDVar8->_vptr_Disposer)
              (pDVar8,(_func_int *)
                      ((long)&(pRVar9->super_ErrorHandler)._vptr_ErrorHandler +
                      (long)(pRVar9->super_ErrorHandler)._vptr_ErrorHandler[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

RpcPipeline(RpcConnectionState& connectionState, kj::Own<QuestionRef>&& questionRef,
                kj::Promise<kj::Own<RpcResponse>>&& redirectLaterParam)
        : connectionState(kj::addRef(connectionState)),
          redirectLater(redirectLaterParam.fork()),
          resolveSelfPromise(KJ_ASSERT_NONNULL(redirectLater).addBranch().then(
              [this](kj::Own<RpcResponse>&& response) {
                resolve(kj::mv(response));
              }, [this](kj::Exception&& exception) {
                resolve(kj::mv(exception));
              }).eagerlyEvaluate([&](kj::Exception&& e) {
                // Make any exceptions thrown from resolve() go to the connection's TaskSet which
                // will cause the connection to be terminated.
                connectionState.tasks.add(kj::mv(e));
              })) {
      // Construct a new RpcPipeline.

      state.init<Waiting>(kj::mv(questionRef));
    }